

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

leaf_t add_container(roaring64_bitmap_t *r,container_t *container,uint8_t typecode)

{
  ulong uVar1;
  container_t **ppcVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t size;
  
  uVar1 = r->first_free;
  if (uVar1 == r->capacity) {
    if (uVar1 == 0) {
      uVar4 = 2;
    }
    else if (uVar1 < 0x400) {
      uVar4 = uVar1 * 2;
    }
    else {
      uVar4 = uVar1 * 5 >> 2;
    }
    ppcVar2 = (container_t **)roaring_realloc(r->containers,uVar4 * 8);
    r->containers = ppcVar2;
    memset(ppcVar2 + r->capacity,0,(uVar4 - uVar1) * 8);
    r->capacity = uVar4;
  }
  uVar3 = next_free_container_idx(r);
  r->first_free = uVar3;
  r->containers[uVar1] = container;
  return (ulong)typecode | uVar1 << 8;
}

Assistant:

static leaf_t add_container(roaring64_bitmap_t *r, container_t *container,
                            uint8_t typecode) {
    uint64_t index = allocate_index(r);
    r->containers[index] = container;
    return create_leaf(index, typecode);
}